

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FileOptions::InternalSwap(FileOptions *this,FileOptions *other)

{
  InternalMetadata *this_00;
  ArenaStringPtr *pAVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  string *psVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  UnknownFieldSet *other_00;
  Arena *pAVar20;
  ArenaStringPtr *pAVar21;
  
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_00 = &(other->super_Message).super_MessageLite._internal_metadata_;
  if ((((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) ||
     (((ulong)this_00->ptr_ & 1) != 0)) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      other_00 = internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      other_00 = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
  pAVar1 = &this->java_package_;
  pAVar20 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar20 & 1) != 0) {
    pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
  }
  pAVar21 = &other->java_package_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar21->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a5958;
    }
  }
  else {
LAB_002a5958:
    psVar5 = pAVar1->ptr_;
    if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar21,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar5);
  }
  pAVar1 = &this->java_outer_classname_;
  pAVar20 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar20 & 1) != 0) {
    pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
  }
  pAVar21 = &other->java_outer_classname_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar21->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a59ae;
    }
  }
  else {
LAB_002a59ae:
    psVar5 = pAVar1->ptr_;
    if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar21,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar5);
  }
  pAVar1 = &this->go_package_;
  pAVar20 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar20 & 1) != 0) {
    pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
  }
  pAVar21 = &other->go_package_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar21->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a5a04;
    }
  }
  else {
LAB_002a5a04:
    psVar5 = pAVar1->ptr_;
    if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar21,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar5);
  }
  pAVar1 = &this->objc_class_prefix_;
  pAVar20 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar20 & 1) != 0) {
    pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
  }
  pAVar21 = &other->objc_class_prefix_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar21->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a5a5a;
    }
  }
  else {
LAB_002a5a5a:
    psVar5 = pAVar1->ptr_;
    if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar21,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar5);
  }
  pAVar1 = &this->csharp_namespace_;
  pAVar20 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar20 & 1) != 0) {
    pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
  }
  pAVar21 = &other->csharp_namespace_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar21->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a5ab0;
    }
  }
  else {
LAB_002a5ab0:
    psVar5 = pAVar1->ptr_;
    if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar21,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar5);
  }
  pAVar1 = &this->swift_prefix_;
  pAVar20 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar20 & 1) != 0) {
    pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
  }
  pAVar21 = &other->swift_prefix_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar21->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a5b06;
    }
  }
  else {
LAB_002a5b06:
    psVar5 = pAVar1->ptr_;
    if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar21,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar5);
  }
  pAVar1 = &this->php_class_prefix_;
  pAVar20 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar20 & 1) != 0) {
    pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
  }
  pAVar21 = &other->php_class_prefix_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar21->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a5b5c;
    }
  }
  else {
LAB_002a5b5c:
    psVar5 = pAVar1->ptr_;
    if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar21,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar5);
  }
  pAVar1 = &this->php_namespace_;
  pAVar20 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar20 & 1) != 0) {
    pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
  }
  pAVar21 = &other->php_namespace_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar21->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a5bb7;
    }
  }
  else {
LAB_002a5bb7:
    psVar5 = pAVar1->ptr_;
    if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar21,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar5);
  }
  pAVar1 = &this->php_metadata_namespace_;
  pAVar20 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar20 & 1) != 0) {
    pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
  }
  pAVar21 = &other->php_metadata_namespace_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar21->ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar1,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      goto LAB_002a5c10;
    }
  }
  else {
LAB_002a5c10:
    psVar5 = pAVar1->ptr_;
    if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar21,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar5);
  }
  pAVar1 = &this->ruby_package_;
  pAVar20 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar20 & 1) != 0) {
    pAVar20 = *(Arena **)((ulong)pAVar20 & 0xfffffffffffffffe);
  }
  pAVar21 = &other->ruby_package_;
  if (pAVar1->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_002a5c96;
    internal::ArenaStringPtr::CreateInstance
              (pAVar1,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar5 = pAVar1->ptr_;
  if (pAVar21->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (pAVar21,pAVar20,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar5);
LAB_002a5c96:
  bVar12 = this->java_multiple_files_;
  bVar13 = this->java_generate_equals_and_hash_;
  bVar14 = this->java_string_check_utf8_;
  bVar15 = this->cc_generic_services_;
  bVar16 = this->java_generic_services_;
  bVar17 = this->py_generic_services_;
  bVar18 = this->php_generic_services_;
  bVar19 = this->deprecated_;
  bVar2 = other->java_generate_equals_and_hash_;
  bVar6 = other->java_string_check_utf8_;
  bVar7 = other->cc_generic_services_;
  bVar8 = other->java_generic_services_;
  bVar9 = other->py_generic_services_;
  bVar10 = other->php_generic_services_;
  bVar11 = other->deprecated_;
  this->java_multiple_files_ = other->java_multiple_files_;
  this->java_generate_equals_and_hash_ = bVar2;
  this->java_string_check_utf8_ = bVar6;
  this->cc_generic_services_ = bVar7;
  this->java_generic_services_ = bVar8;
  this->py_generic_services_ = bVar9;
  this->php_generic_services_ = bVar10;
  this->deprecated_ = bVar11;
  other->java_multiple_files_ = bVar12;
  other->java_generate_equals_and_hash_ = bVar13;
  other->java_string_check_utf8_ = bVar14;
  other->cc_generic_services_ = bVar15;
  other->java_generic_services_ = bVar16;
  other->py_generic_services_ = bVar17;
  other->php_generic_services_ = bVar18;
  other->deprecated_ = bVar19;
  iVar4 = this->optimize_for_;
  this->optimize_for_ = other->optimize_for_;
  other->optimize_for_ = iVar4;
  bVar2 = this->cc_enable_arenas_;
  this->cc_enable_arenas_ = other->cc_enable_arenas_;
  other->cc_enable_arenas_ = bVar2;
  return;
}

Assistant:

void FileOptions::InternalSwap(FileOptions* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
  java_package_.Swap(&other->java_package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  java_outer_classname_.Swap(&other->java_outer_classname_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  go_package_.Swap(&other->go_package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  objc_class_prefix_.Swap(&other->objc_class_prefix_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  csharp_namespace_.Swap(&other->csharp_namespace_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swift_prefix_.Swap(&other->swift_prefix_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  php_class_prefix_.Swap(&other->php_class_prefix_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  php_namespace_.Swap(&other->php_namespace_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  php_metadata_namespace_.Swap(&other->php_metadata_namespace_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ruby_package_.Swap(&other->ruby_package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(FileOptions, deprecated_)
      + sizeof(FileOptions::deprecated_)
      - PROTOBUF_FIELD_OFFSET(FileOptions, java_multiple_files_)>(
          reinterpret_cast<char*>(&java_multiple_files_),
          reinterpret_cast<char*>(&other->java_multiple_files_));
  swap(optimize_for_, other->optimize_for_);
  swap(cc_enable_arenas_, other->cc_enable_arenas_);
}